

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

FieldDescriptor * __thiscall
google::protobuf::DescriptorPool::InternalFindExtensionByNumberNoLock
          (DescriptorPool *this,Descriptor *extendee,int number)

{
  int iVar1;
  pointer this_00;
  FieldDescriptor *result;
  int number_local;
  Descriptor *extendee_local;
  DescriptorPool *this_local;
  
  iVar1 = Descriptor::extension_range_count(extendee);
  if (iVar1 == 0) {
    this_local = (DescriptorPool *)0x0;
  }
  else {
    this_00 = std::
              unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
              ::operator->(&this->tables_);
    this_local = (DescriptorPool *)Tables::FindExtension(this_00,extendee,number);
    if ((this_local == (DescriptorPool *)0x0) &&
       ((this->underlay_ == (DescriptorPool *)0x0 ||
        (this_local = (DescriptorPool *)
                      InternalFindExtensionByNumberNoLock(this->underlay_,extendee,number),
        this_local == (DescriptorPool *)0x0)))) {
      this_local = (DescriptorPool *)0x0;
    }
  }
  return (FieldDescriptor *)this_local;
}

Assistant:

const FieldDescriptor* DescriptorPool::InternalFindExtensionByNumberNoLock(
    const Descriptor* extendee, int number) const {
  if (extendee->extension_range_count() == 0) return nullptr;

  const FieldDescriptor* result = tables_->FindExtension(extendee, number);
  if (result != nullptr) {
    return result;
  }

  if (underlay_ != nullptr) {
    result = underlay_->InternalFindExtensionByNumberNoLock(extendee, number);
    if (result != nullptr) return result;
  }

  return nullptr;
}